

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot.cpp
# Opt level: O2

CK_RV __thiscall Slot::getSlotInfo(Slot *this,CK_SLOT_INFO_PTR info)

{
  ostream *poVar1;
  size_t __n;
  CK_RV CVar2;
  string sDescription;
  char mfgID [33];
  ostringstream osDescription;
  
  if (info == (CK_SLOT_INFO_PTR)0x0) {
    CVar2 = 7;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&osDescription);
    poVar1 = std::operator<<((ostream *)&osDescription,"SoftHSM slot ID 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    builtin_strncpy(mfgID,"SoftHSM project",0x10);
    builtin_memcpy(info->slotDescription,
                   "                                                                ",0x40);
    builtin_memcpy(info->manufacturerID,"                                ",0x20);
    memcpy(info,sDescription._M_dataplus._M_p,sDescription._M_string_length);
    __n = strlen(mfgID);
    memcpy(info->manufacturerID,mfgID,__n);
    info->flags = 1;
    (info->hardwareVersion).major = '\x02';
    (info->hardwareVersion).minor = '\x06';
    (info->firmwareVersion).major = '\x02';
    (info->firmwareVersion).minor = '\x06';
    std::__cxx11::string::~string((string *)&sDescription);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&osDescription);
    CVar2 = 0;
  }
  return CVar2;
}

Assistant:

CK_RV Slot::getSlotInfo(CK_SLOT_INFO_PTR info)
{
	if (info == NULL)
	{
		return CKR_ARGUMENTS_BAD;
	}

	std::ostringstream osDescription;
	osDescription << "SoftHSM slot ID 0x" << std::hex << slotID;
	const std::string sDescription(osDescription.str());

	char mfgID[33];
	snprintf(mfgID, 33, "SoftHSM project");

	memset(info->slotDescription, ' ', 64);
	memset(info->manufacturerID, ' ', 32);
	memcpy(info->slotDescription, sDescription.data(), sDescription.size());
	memcpy(info->manufacturerID, mfgID, strlen(mfgID));

	info->flags = CKF_TOKEN_PRESENT;

	info->hardwareVersion.major = VERSION_MAJOR;
	info->hardwareVersion.minor = VERSION_MINOR;
	info->firmwareVersion.major = VERSION_MAJOR;
	info->firmwareVersion.minor = VERSION_MINOR;

	return CKR_OK;
}